

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::UniformValue::streamValue
          (UniformValue *this,ostringstream *str,int arrayElement,int column)

{
  pair<int,_int> pVar1;
  bool bVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  pVar1 = (this->type).size;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (&str->super_basic_ostream<char,_std::char_traits<char>_>,
                      (this->type).refStrType._M_dataplus._M_p,
                      (this->type).refStrType._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  if ((this->type).baseType == 0x82e6) {
    lVar6 = 0;
    do {
      if (lVar6 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&str->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
      }
      std::ostream::_M_insert<double>
                ((double)(this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[(arrayElement << 2) + lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
  }
  else {
    iVar4 = pVar1.second * pVar1.first;
    if (((this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start) && (0 < (this->type).size.first)) {
      iVar5 = 0;
      do {
        if (iVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&str->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        }
        poVar3 = std::ostream::_M_insert<double>
                           ((double)(this->fValues).
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start
                                    [(this->type).size.first * column + iVar4 * arrayElement + iVar5
                                    ]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,".0",2);
      } while (((this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start) &&
              (iVar5 = iVar5 + 1, iVar5 < (this->type).size.first));
    }
    if (((this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start) && (0 < (this->type).size.first)) {
      iVar5 = iVar4 * arrayElement;
      lVar6 = 1;
      do {
        if (lVar6 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&str->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        }
        std::ostream::operator<<
                  (str,(this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar5]);
        if ((this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) break;
        iVar5 = iVar5 + 1;
        bVar2 = lVar6 < (this->type).size.first;
        lVar6 = lVar6 + 1;
      } while (bVar2);
    }
    if (((this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start) && (0 < (this->type).size.first)) {
      iVar4 = iVar4 * arrayElement;
      lVar6 = 1;
      do {
        if (lVar6 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&str->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        }
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           (str,(this->uValues).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar4]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"u",1);
        if ((this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) break;
        iVar4 = iVar4 + 1;
        bVar2 = lVar6 < (this->type).size.first;
        lVar6 = lVar6 + 1;
      } while (bVar2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&str->super_basic_ostream<char,_std::char_traits<char>_>,")",1);
  return;
}

Assistant:

void streamValue(std::ostringstream& str, int arrayElement = 0, int column = 0) const
	{
		int arrayElementSize = type.getSize().first * type.getSize().second;

		str << type.refStr() << "(";

		if (type.getBaseType() == GL_SAMPLER)
		{
			for (size_t elem = 0; elem < 4; elem++)
			{
				if (elem)
					str << ", ";
				str << fValues[arrayElement * 4 + elem];
			}
			str << ")";
			return;
		}

		for (int elem = 0; fValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << fValues[arrayElement * arrayElementSize + column * type.getSize().first + elem] << ".0";
		}
		for (int elem = 0; iValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << iValues[arrayElement * arrayElementSize + elem];
		}
		for (int elem = 0; uValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << uValues[arrayElement * arrayElementSize + elem] << "u";
		}
		str << ")";
	}